

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,string *attribute)

{
  ostream *poVar1;
  
  if ((name->_M_string_length != 0) && (attribute->_M_string_length != 0)) {
    poVar1 = this->m_os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
    writeEncodedText(this,attribute);
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,"\"",1);
  }
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, std::string const& attribute ) {
            if( !name.empty() && !attribute.empty() ) {
                stream() << " " << name << "=\"";
                writeEncodedText( attribute );
                stream() << "\"";
            }
            return *this;
        }